

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O3

bool __thiscall
miniros::NodeHandle::getParamCached
          (NodeHandle *this,string *key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *map)

{
  bool bVar1;
  TopicManagerPtr *pTVar2;
  string local_50;
  MasterLink *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  pTVar2 = TopicManager::instance();
  TopicManager::getMasterLink
            ((pTVar2->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  resolveName(&local_50,this,key,true);
  bVar1 = MasterLink::getCached(local_30,&local_50,map);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return bVar1;
}

Assistant:

bool NodeHandle::getParamCached(const std::string& key, std::map<std::string, int>& map) const
{
  return getMasterLink()->getCached(resolveName(key), map);
}